

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  cmCompiledGeneratorExpression *pcVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  _Base_ptr __n;
  bool bVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  string outputFileName;
  string local_2b8;
  string rawCondition;
  cmGeneratedFileStream fout;
  
  pcVar1 = (this->Condition)._M_t.
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  rawCondition._M_dataplus._M_p = (pointer)&rawCondition.field_2;
  _Var2._M_p = (pcVar1->Input)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rawCondition,_Var2._M_p,_Var2._M_p + (pcVar1->Input)._M_string_length);
  if (rawCondition._M_string_length == 0) {
LAB_0036569d:
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((this->OutputFileExpr)._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,lang);
    outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&outputFileName,pcVar3,pcVar3 + psVar6->_M_string_length);
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       (inputExpression,lg,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
    bVar4 = cmsys::SystemTools::FileIsFullPath(&outputFileName);
    if (bVar4) {
      cmsys::SystemTools::CollapseFullPath((string *)&fout,&outputFileName);
    }
    else {
      FixRelativePath((string *)&fout,this,&outputFileName,PathForOutput,lg);
    }
    std::__cxx11::string::operator=((string *)&outputFileName,(string *)&fout);
    if (fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)
           &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                      + 1);
    }
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&outputFiles->_M_t,&outputFileName);
    if ((_Rb_tree_header *)iVar8._M_node == &(outputFiles->_M_t)._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lg->Makefile->OutputFiles,&outputFileName);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Files,&outputFileName);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](outputFiles,&outputFileName);
      std::__cxx11::string::_M_assign((string *)pmVar9);
      cmGeneratedFileStream::cmGeneratedFileStream(&fout,&outputFileName,false,None);
      cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fout,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      bVar4 = cmGeneratedFileStream::Close(&fout);
      if (bVar4 && perm != 0) {
        cmsys::SystemTools::SetPermissions(outputFileName._M_dataplus._M_p,perm,false);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
      goto LAB_003658e3;
    }
    __n = iVar8._M_node[2]._M_parent;
    if ((__n == (_Base_ptr)psVar6->_M_string_length) &&
       ((__n == (_Base_ptr)0x0 ||
        (iVar5 = bcmp(*(void **)(iVar8._M_node + 2),(psVar6->_M_dataplus)._M_p,(size_t)__n),
        iVar5 == 0)))) goto LAB_003658e3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fout,
               "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
               ,0xb8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fout,outputFileName._M_dataplus._M_p,outputFileName._M_string_length);
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((this->Condition)._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,lang);
    outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&outputFileName,pcVar3,pcVar3 + psVar6->_M_string_length);
    iVar5 = std::__cxx11::string::compare((char *)&outputFileName);
    if (iVar5 == 0) goto LAB_003658e3;
    iVar5 = std::__cxx11::string::compare((char *)&outputFileName);
    if (iVar5 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
        operator_delete(outputFileName._M_dataplus._M_p,
                        outputFileName.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0036569d;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fout,"Evaluation file condition \"",0x1b);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&fout,rawCondition._M_dataplus._M_p,rawCondition._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\" did not evaluate to valid content. Got \"",0x2a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,outputFileName._M_dataplus._M_p,outputFileName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
  std::ios_base::~ios_base
            ((ios_base *)
             &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
LAB_003658e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
    operator_delete(outputFileName._M_dataplus._M_p,outputFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rawCondition._M_dataplus._M_p != &rawCondition.field_2) {
    operator_delete(rawCondition._M_dataplus._M_p,rawCondition.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  if (!rawCondition.empty()) {
    std::string condResult = this->Condition->Evaluate(
      lg, config, false, nullptr, nullptr, nullptr, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string outputFileName = this->OutputFileExpr->Evaluate(
    lg, config, false, nullptr, nullptr, nullptr, lang);
  const std::string& outputContent = inputExpression->Evaluate(
    lg, config, false, nullptr, nullptr, nullptr, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  std::map<std::string, std::string>::iterator it =
    outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  cmGeneratedFileStream fout(outputFileName);
  fout.SetCopyIfDifferent(true);
  fout << outputContent;
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}